

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printPartStats(ostream *out,partStats *data,string *indent,int timing,bool raw,bool stats)

{
  bool bVar1;
  ostream *poVar2;
  
  if ((timing & 1U) == 0) {
    bVar1 = false;
  }
  else {
    if ((data->sizeData).isDeep == true) {
      poVar2 = std::operator<<(out,(string *)indent);
      std::operator<<(poVar2,"\"count read time\": ");
      printTiming(&data->countReadPerf,out,raw,stats);
      std::operator<<(out,",\n");
    }
    poVar2 = std::operator<<(out,(string *)indent);
    std::operator<<(poVar2,"\"read time\": ");
    printTiming(&data->readPerf,out,raw,stats);
    bVar1 = true;
  }
  if ((timing & 2U) != 0) {
    if (bVar1) {
      std::operator<<(out,",\n");
    }
    poVar2 = std::operator<<(out,(string *)indent);
    std::operator<<(poVar2,"\"write time\": ");
    printTiming(&data->writePerf,out,raw,stats);
    bVar1 = true;
  }
  if ((timing & 4U) == 0) {
    return;
  }
  if ((data->sizeData).isDeep == true) {
    if (bVar1) {
      std::operator<<(out,",\n");
    }
    poVar2 = std::operator<<(out,(string *)indent);
    std::operator<<(poVar2,"\"count re-read time\": ");
    printTiming(&data->countRereadPerf,out,raw,stats);
  }
  else if (!bVar1) goto LAB_00106105;
  std::operator<<(out,",\n");
LAB_00106105:
  poVar2 = std::operator<<(out,(string *)indent);
  std::operator<<(poVar2,"\"re-read time\": ");
  printTiming(&data->rereadPerf,out,raw,stats);
  return;
}

Assistant:

void
printPartStats (
    ostream&         out,
    const partStats& data,
    const string     indent,
    int              timing,
    bool             raw,
    bool             stats)
{
    bool output = false;
    if (timing & options::TIME_READ)
    {
        if (data.sizeData.isDeep)
        {
            out << indent << "\"count read time\": ";
            printTiming (data.countReadPerf, out, raw, stats);
            output = true;
        }
        if (output) { out << ",\n"; }
        out << indent << "\"read time\": ";
        printTiming (data.readPerf, out, raw, stats);
        output = true;
    }

    if (timing & options::TIME_WRITE)
    {
        if (output) { out << ",\n"; }
        output = true;
        out << indent << "\"write time\": ";
        printTiming (data.writePerf, out, raw, stats);
    }

    if (timing & options::TIME_REREAD)
    {
        if (data.sizeData.isDeep)
        {
            if (output) { out << ",\n"; }
            output = true;
            out << indent << "\"count re-read time\": ";
            printTiming (data.countRereadPerf, out, raw, stats);
        }
        if (output) { out << ",\n"; }
        output = true;
        out << indent << "\"re-read time\": ";
        printTiming (data.rereadPerf, out, raw, stats);
    }
}